

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

int denoise_and_encode(AV1_COMP *cpi,uint8_t *dest,size_t dest_size,EncodeFrameInput *frame_input,
                      EncodeFrameParams *frame_params,size_t *frame_size)

{
  AV1_PRIMARY *pAVar1;
  YV12_BUFFER_CONFIG *pYVar2;
  AV1_PRIMARY *pAVar3;
  byte bVar4;
  FRAME_UPDATE_TYPE FVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  YV12_BUFFER_CONFIG *pYVar9;
  long *in_RCX;
  AV1_COMP *in_RDX;
  YV12_BUFFER_CONFIG *unaff_RBX;
  undefined8 in_RSI;
  AV1_COMP *in_RDI;
  EncodeFrameParams *in_R8;
  int in_stack_00000040;
  int in_stack_00000048;
  aom_codec_frame_buffer_t *in_stack_00000050;
  int allow_tpl;
  int set_mv_params;
  int arf_src_index;
  YV12_BUFFER_CONFIG *tf_buf_second_arf;
  int ret;
  YV12_BUFFER_CONFIG *tf_buf;
  int q_index;
  int bottom_index;
  int top_index;
  FRAME_DIFF frame_diff;
  int show_existing_alt_ref;
  YV12_BUFFER_CONFIG *source_buffer;
  double y_noise_level;
  int allow_kf_filtering;
  int apply_filtering;
  int is_second_arf;
  FRAME_UPDATE_TYPE update_type;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  AV1EncoderConfig *oxcf;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffef8;
  TplParams *in_stack_ffffffffffffff00;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  aom_bit_depth_t in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  uint uVar10;
  byte in_stack_ffffffffffffff2c;
  byte in_stack_ffffffffffffff2d;
  byte in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  bool bVar11;
  undefined1 uVar12;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff30;
  byte local_c6;
  byte local_c5;
  int in_stack_ffffffffffffff54;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  AV1_COMMON *in_stack_ffffffffffffff70;
  int local_7c;
  double in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff98;
  uint uVar13;
  AV1_COMMON *cm_00;
  AV1EncoderConfig *oxcf_00;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  oxcf_00 = &in_RDI->oxcf;
  cm_00 = &in_RDI->common;
  pAVar1 = in_RDI->ppi;
  FVar5 = get_frame_update_type(&in_RDI->ppi->gf_group,(uint)in_RDI->gf_frame_index);
  iVar7 = av1_gop_is_second_arf(&pAVar1->gf_group,(uint)in_RDI->gf_frame_index);
  iVar8 = av1_is_temporal_filter_on(oxcf_00);
  local_c5 = 0;
  if (iVar8 != 0) {
    iVar8 = is_stat_generation_stage(in_RDI);
    local_c5 = iVar8 != 0 ^ 0xff;
  }
  uVar13 = (uint)(local_c5 & 1);
  if (((FVar5 != '\0') && (FVar5 != '\x03')) && (iVar7 == 0)) {
    uVar13 = 0;
  }
  if (uVar13 != 0) {
    if (in_R8->frame_type == '\0') {
      local_c6 = 0;
      if (((oxcf_00->kf_cfg).enable_keyframe_filtering != 0) &&
         (local_c6 = 0, in_R8->show_existing_frame == 0)) {
        iVar8 = is_lossless_requested(&oxcf_00->rc_cfg);
        local_c6 = iVar8 != 0 ^ 0xff;
      }
      in_stack_ffffffffffffff98 = (uint)(local_c6 & 1);
      if (in_stack_ffffffffffffff98 == 0) {
        uVar13 = 0;
      }
      else {
        in_stack_ffffffffffffff90 = 0.0;
        av1_estimate_noise_level
                  (in_stack_ffffffffffffff30,
                   (double *)
                   CONCAT17(in_stack_ffffffffffffff2f,
                            CONCAT16(in_stack_ffffffffffffff2e,
                                     CONCAT15(in_stack_ffffffffffffff2d,
                                              CONCAT14(in_stack_ffffffffffffff2c,
                                                       in_stack_ffffffffffffff28)))),
                   in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                   in_stack_ffffffffffffff18);
        uVar13 = (uint)(0.0 < in_stack_ffffffffffffff90);
      }
      if (uVar13 != 0) {
        av1_setup_past_independence((AV1_COMMON *)0x17ad2e5);
      }
    }
    else if (iVar7 != 0) {
      uVar13 = (in_RDI->sf).hl_sf.second_alt_ref_filtering;
    }
  }
  pYVar2 = (YV12_BUFFER_CONFIG *)*in_RCX;
  if (uVar13 != 0) {
    local_7c = 0;
    in_stack_ffffffffffffff6c = 0;
    in_stack_ffffffffffffff68 = 0;
    in_stack_ffffffffffffff64 =
         av1_rc_pick_q_and_bounds
                   ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                    (int *)in_stack_ffffffffffffff08,&in_stack_ffffffffffffff00->ready);
    (cm_00->current_frame).frame_type = in_R8->frame_type;
    if ((FVar5 == '\0') || (FVar5 == '\x03')) {
      in_stack_ffffffffffffff58 =
           av1_tf_info_get_filtered_buf
                     (&in_RDI->ppi->tf_info,(uint)in_RDI->gf_frame_index,
                      (FRAME_DIFF *)&stack0xffffffffffffff70);
      if (in_stack_ffffffffffffff58 != (YV12_BUFFER_CONFIG *)0x0) {
        *in_RCX = (long)in_stack_ffffffffffffff58;
        local_7c = av1_check_show_filtered_frame
                             ((YV12_BUFFER_CONFIG *)
                              CONCAT17(in_stack_ffffffffffffff2f,
                                       CONCAT16(in_stack_ffffffffffffff2e,
                                                CONCAT15(in_stack_ffffffffffffff2d,
                                                         CONCAT14(in_stack_ffffffffffffff2c,
                                                                  in_stack_ffffffffffffff28)))),
                              (FRAME_DIFF *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
        if (local_7c == 0) {
          (in_RDI->common).showable_frame = 0;
        }
        else {
          (in_RDI->common).showable_frame = (in_RDI->common).showable_frame | 1;
        }
      }
      if ((pAVar1->gf_group).frame_type[in_RDI->gf_frame_index] != '\0') {
        in_RDI->ppi->show_existing_alt_ref = local_7c;
      }
    }
    if (iVar7 != 0) {
      in_stack_fffffffffffffef0 = (cm_00->features).byte_alignment;
      in_stack_fffffffffffffef8 = (YV12_BUFFER_CONFIG *)0x0;
      in_stack_ffffffffffffff00 = (TplParams *)0x0;
      in_stack_ffffffffffffff08 = (YV12_BUFFER_CONFIG *)0x0;
      in_stack_ffffffffffffff10 = (uint)(in_RDI->alloc_pyramid & 1);
      in_stack_ffffffffffffff18 = 0;
      in_stack_ffffffffffffff54 =
           aom_realloc_frame_buffer
                     (unaff_RBX,in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,
                      (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20),
                      in_stack_00000040,in_stack_00000048,in_stack_00000050,_set_mv_params,
                      tf_buf_second_arf,SUB81((ulong)in_RSI >> 0x18,0),(int)tf_buf);
      if (in_stack_ffffffffffffff54 != 0) {
        aom_internal_error(cm_00->error,AOM_CODEC_MEM_ERROR,"Failed to allocate tf_buf_second_arf");
      }
      pAVar3 = in_RDI->ppi;
      av1_temporal_filter((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                          (FRAME_DIFF *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
      iVar7 = av1_check_show_filtered_frame
                        ((YV12_BUFFER_CONFIG *)
                         CONCAT17(in_stack_ffffffffffffff2f,
                                  CONCAT16(in_stack_ffffffffffffff2e,
                                           CONCAT15(in_stack_ffffffffffffff2d,
                                                    CONCAT14(in_stack_ffffffffffffff2c,
                                                             in_stack_ffffffffffffff28)))),
                         (FRAME_DIFF *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                         ,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
      if (iVar7 != 0) {
        av1_num_planes(cm_00);
        aom_extend_frame_borders_c
                  ((YV12_BUFFER_CONFIG *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffeec);
        *in_RCX = (long)&(pAVar3->tf_info).tf_buf_second_arf;
      }
      (in_RDI->common).showable_frame = (in_RDI->common).showable_frame | 1;
    }
    if ((pYVar2->metadata != (aom_metadata_array_t *)0x0) &&
       (iVar7 = aom_copy_metadata_to_frame_buffer
                          (in_stack_fffffffffffffef8,
                           (aom_metadata_array_t *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)),
       iVar7 != 0)) {
      aom_internal_error(cm_00->error,AOM_CODEC_MEM_ERROR,
                         "Failed to copy source metadata to the temporal filtered frame");
    }
  }
  iVar7 = (int)((ulong)in_RCX >> 0x20);
  bVar11 = true;
  if ((in_R8->frame_type != '\0') && (bVar11 = true, FVar5 != '\x03')) {
    bVar11 = FVar5 == '\x02';
  }
  cm_00->show_frame = in_R8->show_frame;
  (cm_00->current_frame).frame_type = in_R8->frame_type;
  uVar12 = bVar11;
  av1_set_frame_size((AV1_COMP *)CONCAT44(uVar13,in_stack_ffffffffffffff98),
                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                     SUB84(in_stack_ffffffffffffff90,0));
  if (bVar11 != false) {
    av1_set_mv_search_params
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  }
  if ((in_RDI->gf_frame_index == '\0') && (iVar8 = is_stat_generation_stage(in_RDI), iVar8 == 0)) {
    in_stack_ffffffffffffff2e = 0;
    if (1 < (oxcf_00->gf_cfg).lag_in_frames) {
      in_stack_ffffffffffffff2e = (oxcf_00->algo_cfg).enable_tpl_model;
    }
    bVar6 = in_stack_ffffffffffffff2e & 1;
    if (0x69 < (pAVar1->gf_group).size) {
      bVar6 = 0;
    }
    bVar4 = bVar6;
    if ((((in_R8->frame_type != '\0') && (in_stack_ffffffffffffff2d = 0, bVar4 = 0, bVar6 != 0)) &&
        (in_stack_ffffffffffffff2c = 1, in_stack_ffffffffffffff2d = in_stack_ffffffffffffff2c,
        bVar4 = in_stack_ffffffffffffff2c, FVar5 != '\x03')) &&
       (in_stack_ffffffffffffff2c = 1, in_stack_ffffffffffffff2d = in_stack_ffffffffffffff2c,
       bVar4 = in_stack_ffffffffffffff2c, FVar5 != '\x02')) {
      uVar10 = in_stack_ffffffffffffff28 & 0xffffff;
      if (in_RDI->use_ducky_encode != 0) {
        uVar10 = CONCAT13((in_RDI->ducky_encode_info).frame_info.gop_mode == '\x01',
                          (int3)in_stack_ffffffffffffff28);
      }
      in_stack_ffffffffffffff2c = (byte)(uVar10 >> 0x18);
      in_stack_ffffffffffffff28 = uVar10;
      in_stack_ffffffffffffff2d = in_stack_ffffffffffffff2c;
      bVar4 = in_stack_ffffffffffffff2c;
    }
    if (bVar4 == 0) {
      av1_init_tpl_stats(in_stack_ffffffffffffff00);
    }
    else if (in_RDI->skip_tpl_setup_stats == 0) {
      av1_tpl_preload_rc_estimate
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (EncodeFrameParams *)in_stack_ffffffffffffff08);
      av1_tpl_setup_stats(in_RDX,iVar7,in_R8);
    }
  }
  iVar7 = av1_encode((AV1_COMP *)
                     CONCAT17(uVar12,CONCAT16(in_stack_ffffffffffffff2e,
                                              CONCAT15(in_stack_ffffffffffffff2d,
                                                       CONCAT14(in_stack_ffffffffffffff2c,
                                                                in_stack_ffffffffffffff28)))),
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                     (EncodeFrameInput *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (EncodeFrameParams *)in_stack_ffffffffffffff08,
                     (size_t *)in_stack_ffffffffffffff00);
  if (iVar7 == 0) {
    if ((uVar13 != 0) &&
       (iVar7 = is_psnr_calc_enabled
                          ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                          ), iVar7 != 0)) {
      pYVar9 = av1_realloc_and_scale_if_required
                         (in_stack_ffffffffffffff70,
                          (YV12_BUFFER_CONFIG *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (YV12_BUFFER_CONFIG *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (InterpFilter)((ulong)in_stack_ffffffffffffff58 >> 0x38),
                          (int)in_stack_ffffffffffffff58,
                          SUB41((uint)in_stack_ffffffffffffff54 >> 0x18,0),
                          SUB41((uint)in_stack_ffffffffffffff54 >> 0x10,0),in_stack_ffffffffffffff98
                          ,SUB41((uint)in_stack_ffffffffffffff54 >> 8,0));
      in_RDI->source = pYVar9;
      in_RDI->unscaled_source = pYVar2;
    }
    iVar7 = 0;
  }
  else {
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int denoise_and_encode(AV1_COMP *const cpi, uint8_t *const dest,
                              size_t dest_size,
                              EncodeFrameInput *const frame_input,
                              const EncodeFrameParams *const frame_params,
                              size_t *const frame_size) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  if (cpi->oxcf.pass == 2) start_timing(cpi, denoise_and_encode_time);
#endif
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  AV1_COMMON *const cm = &cpi->common;

  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  FRAME_UPDATE_TYPE update_type =
      get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
  const int is_second_arf =
      av1_gop_is_second_arf(gf_group, cpi->gf_frame_index);

  // Decide whether to apply temporal filtering to the source frame.
  int apply_filtering =
      av1_is_temporal_filter_on(oxcf) && !is_stat_generation_stage(cpi);
  if (update_type != KF_UPDATE && update_type != ARF_UPDATE && !is_second_arf) {
    apply_filtering = 0;
  }
  if (apply_filtering) {
    if (frame_params->frame_type == KEY_FRAME) {
      // TODO(angiebird): Move the noise level check to av1_tf_info_filtering.
      // Decide whether it is allowed to perform key frame filtering
      int allow_kf_filtering = oxcf->kf_cfg.enable_keyframe_filtering &&
                               !frame_params->show_existing_frame &&
                               !is_lossless_requested(&oxcf->rc_cfg);
      if (allow_kf_filtering) {
        double y_noise_level = 0.0;
        av1_estimate_noise_level(
            frame_input->source, &y_noise_level, AOM_PLANE_Y, AOM_PLANE_Y,
            cm->seq_params->bit_depth, NOISE_ESTIMATION_EDGE_THRESHOLD);
        apply_filtering = y_noise_level > 0;
      } else {
        apply_filtering = 0;
      }
      // If we are doing kf filtering, set up a few things.
      if (apply_filtering) {
        av1_setup_past_independence(cm);
      }
    } else if (is_second_arf) {
      apply_filtering = cpi->sf.hl_sf.second_alt_ref_filtering;
    }
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  if (cpi->oxcf.pass == 2) start_timing(cpi, apply_filtering_time);
#endif
  // Save the pointer to the original source image.
  YV12_BUFFER_CONFIG *source_buffer = frame_input->source;
  // apply filtering to frame
  if (apply_filtering) {
    int show_existing_alt_ref = 0;
    FRAME_DIFF frame_diff;
    int top_index = 0;
    int bottom_index = 0;
    const int q_index = av1_rc_pick_q_and_bounds(
        cpi, cpi->oxcf.frm_dim_cfg.width, cpi->oxcf.frm_dim_cfg.height,
        cpi->gf_frame_index, &bottom_index, &top_index);

    // TODO(bohanli): figure out why we need frame_type in cm here.
    cm->current_frame.frame_type = frame_params->frame_type;
    if (update_type == KF_UPDATE || update_type == ARF_UPDATE) {
      YV12_BUFFER_CONFIG *tf_buf = av1_tf_info_get_filtered_buf(
          &cpi->ppi->tf_info, cpi->gf_frame_index, &frame_diff);
      if (tf_buf != NULL) {
        frame_input->source = tf_buf;
        show_existing_alt_ref = av1_check_show_filtered_frame(
            tf_buf, &frame_diff, q_index, cm->seq_params->bit_depth);
        if (show_existing_alt_ref) {
          cpi->common.showable_frame |= 1;
        } else {
          cpi->common.showable_frame = 0;
        }
      }
      if (gf_group->frame_type[cpi->gf_frame_index] != KEY_FRAME) {
        cpi->ppi->show_existing_alt_ref = show_existing_alt_ref;
      }
    }

    if (is_second_arf) {
      // Allocate the memory for tf_buf_second_arf buffer, only when it is
      // required.
      int ret = aom_realloc_frame_buffer(
          &cpi->ppi->tf_info.tf_buf_second_arf, oxcf->frm_dim_cfg.width,
          oxcf->frm_dim_cfg.height, cm->seq_params->subsampling_x,
          cm->seq_params->subsampling_y, cm->seq_params->use_highbitdepth,
          cpi->oxcf.border_in_pixels, cm->features.byte_alignment, NULL, NULL,
          NULL, cpi->alloc_pyramid, 0);
      if (ret)
        aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate tf_buf_second_arf");

      YV12_BUFFER_CONFIG *tf_buf_second_arf =
          &cpi->ppi->tf_info.tf_buf_second_arf;
      // We didn't apply temporal filtering for second arf ahead in
      // av1_tf_info_filtering().
      const int arf_src_index = gf_group->arf_src_offset[cpi->gf_frame_index];
      // Right now, we are still using tf_buf_second_arf due to
      // implementation complexity.
      // TODO(angiebird): Reuse tf_info->tf_buf here.
      av1_temporal_filter(cpi, arf_src_index, cpi->gf_frame_index, &frame_diff,
                          tf_buf_second_arf);
      show_existing_alt_ref = av1_check_show_filtered_frame(
          tf_buf_second_arf, &frame_diff, q_index, cm->seq_params->bit_depth);
      if (show_existing_alt_ref) {
        aom_extend_frame_borders(tf_buf_second_arf, av1_num_planes(cm));
        frame_input->source = tf_buf_second_arf;
      }
      // Currently INTNL_ARF_UPDATE only do show_existing.
      cpi->common.showable_frame |= 1;
    }

    // Copy source metadata to the temporal filtered frame
    if (source_buffer->metadata &&
        aom_copy_metadata_to_frame_buffer(frame_input->source,
                                          source_buffer->metadata)) {
      aom_internal_error(
          cm->error, AOM_CODEC_MEM_ERROR,
          "Failed to copy source metadata to the temporal filtered frame");
    }
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  if (cpi->oxcf.pass == 2) end_timing(cpi, apply_filtering_time);
#endif

  int set_mv_params = frame_params->frame_type == KEY_FRAME ||
                      update_type == ARF_UPDATE || update_type == GF_UPDATE;
  cm->show_frame = frame_params->show_frame;
  cm->current_frame.frame_type = frame_params->frame_type;
  // TODO(bohanli): Why is this? what part of it is necessary?
  av1_set_frame_size(cpi, cm->width, cm->height);
  if (set_mv_params) av1_set_mv_search_params(cpi);

#if CONFIG_RD_COMMAND
  if (frame_params->frame_type == KEY_FRAME) {
    char filepath[] = "rd_command.txt";
    av1_read_rd_command(filepath, &cpi->rd_command);
  }
#endif  // CONFIG_RD_COMMAND
  if (cpi->gf_frame_index == 0 && !is_stat_generation_stage(cpi)) {
    // perform tpl after filtering
    int allow_tpl =
        oxcf->gf_cfg.lag_in_frames > 1 && oxcf->algo_cfg.enable_tpl_model;
    if (gf_group->size > MAX_LENGTH_TPL_FRAME_STATS) {
      allow_tpl = 0;
    }
    if (frame_params->frame_type != KEY_FRAME) {
      // In rare case, it's possible to have non ARF/GF update_type here.
      // We should set allow_tpl to zero in the situation
      allow_tpl =
          allow_tpl && (update_type == ARF_UPDATE || update_type == GF_UPDATE ||
                        (cpi->use_ducky_encode &&
                         cpi->ducky_encode_info.frame_info.gop_mode ==
                             DUCKY_ENCODE_GOP_MODE_RCL));
    }

    if (allow_tpl) {
      if (!cpi->skip_tpl_setup_stats) {
        av1_tpl_preload_rc_estimate(cpi, frame_params);
        av1_tpl_setup_stats(cpi, 0, frame_params);
#if CONFIG_BITRATE_ACCURACY && !CONFIG_THREE_PASS
        assert(cpi->gf_frame_index == 0);
        av1_vbr_rc_update_q_index_list(&cpi->vbr_rc_info, &cpi->ppi->tpl_data,
                                       gf_group, cm->seq_params->bit_depth);
#endif
      }
    } else {
      av1_init_tpl_stats(&cpi->ppi->tpl_data);
    }
#if CONFIG_BITRATE_ACCURACY && CONFIG_THREE_PASS
    if (cpi->oxcf.pass == AOM_RC_SECOND_PASS &&
        cpi->second_pass_log_stream != NULL) {
      TPL_INFO *tpl_info;
      AOM_CHECK_MEM_ERROR(cm->error, tpl_info, aom_malloc(sizeof(*tpl_info)));
      av1_pack_tpl_info(tpl_info, gf_group, &cpi->ppi->tpl_data);
      av1_write_tpl_info(tpl_info, cpi->second_pass_log_stream,
                         cpi->common.error);
      aom_free(tpl_info);
    }
#endif  // CONFIG_BITRATE_ACCURACY && CONFIG_THREE_PASS
  }

  if (av1_encode(cpi, dest, dest_size, frame_input, frame_params, frame_size) !=
      AOM_CODEC_OK) {
    return AOM_CODEC_ERROR;
  }

  // Set frame_input source to true source for psnr calculation.
  if (apply_filtering && is_psnr_calc_enabled(cpi)) {
    cpi->source = av1_realloc_and_scale_if_required(
        cm, source_buffer, &cpi->scaled_source, cm->features.interp_filter, 0,
        false, true, cpi->oxcf.border_in_pixels, cpi->alloc_pyramid);
    cpi->unscaled_source = source_buffer;
  }
#if CONFIG_COLLECT_COMPONENT_TIMING
  if (cpi->oxcf.pass == 2) end_timing(cpi, denoise_and_encode_time);
#endif
  return AOM_CODEC_OK;
}